

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O1

size_type __thiscall
re2c::free_list<re2c::Range_*>::erase(free_list<re2c::Range_*> *this,key_type *key)

{
  size_t sVar1;
  size_type sVar2;
  pair<std::_Rb_tree_iterator<re2c::Range_*>,_std::_Rb_tree_iterator<re2c::Range_*>_> pVar3;
  
  if (this->in_clear == false) {
    pVar3 = std::
            _Rb_tree<re2c::Range_*,_re2c::Range_*,_std::_Identity<re2c::Range_*>,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
            ::equal_range((_Rb_tree<re2c::Range_*,_re2c::Range_*,_std::_Identity<re2c::Range_*>,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
                           *)this,key);
    sVar1 = (this->
            super_set<re2c::Range_*,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>)._M_t
            ._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<re2c::Range_*,_re2c::Range_*,_std::_Identity<re2c::Range_*>,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
    ::_M_erase_aux((_Rb_tree<re2c::Range_*,_re2c::Range_*,_std::_Identity<re2c::Range_*>,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
                    *)this,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
    sVar2 = sVar1 - (this->
                    super_set<re2c::Range_*,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
                    )._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_type erase(const key_type& key)
	{
		if (!in_clear)
		{
			return std::set<_Ty>::erase(key);
		}
		return 0;
	}